

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_errmsg(CPState *cp,CPToken tok,ErrMsg em,...)

{
  char in_AL;
  undefined8 in_RCX;
  SBuf *pSVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_178 [24];
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined1 local_c8 [8];
  va_list argp;
  lua_State *L;
  char *tokstr;
  char *msg;
  ErrMsg em_local;
  CPToken tok_local;
  CPState *cp_local;
  char *w;
  char *w_1;
  char *local_28;
  char *local_10;
  
  if (in_AL != '\0') {
    local_148 = in_XMM0_Qa;
    local_138 = in_XMM1_Qa;
    local_128 = in_XMM2_Qa;
    local_118 = in_XMM3_Qa;
    local_108 = in_XMM4_Qa;
    local_f8 = in_XMM5_Qa;
    local_e8 = in_XMM6_Qa;
    local_d8 = in_XMM7_Qa;
  }
  local_160 = in_RCX;
  local_158 = in_R8;
  local_150 = in_R9;
  if (tok == 0) {
    L = (lua_State *)0x0;
  }
  else if ((((tok == 0x100) || (tok == 0x102)) || (tok == 0x101)) || (0x10c < tok)) {
    if ((cp->sb).w == (cp->sb).b) {
      pSVar1 = &cp->sb;
      if ((int)(cp->sb).e == (int)pSVar1->w) {
        local_10 = lj_buf_more2(pSVar1,1);
      }
      else {
        local_10 = pSVar1->w;
      }
      *local_10 = '$';
      pSVar1->w = local_10 + 1;
    }
    pSVar1 = &cp->sb;
    if ((int)(cp->sb).e == (int)pSVar1->w) {
      local_28 = lj_buf_more2(pSVar1,1);
    }
    else {
      local_28 = pSVar1->w;
    }
    *local_28 = '\0';
    pSVar1->w = local_28 + 1;
    L = (lua_State *)(cp->sb).b;
  }
  else {
    L = (lua_State *)cp_tok2str(cp,tok);
  }
  argp[0].reg_save_area = cp->L;
  argp[0].overflow_arg_area = local_178;
  argp[0]._0_8_ = &stack0x00000008;
  local_c8._4_4_ = 0x30;
  local_c8._0_4_ = 0x18;
  tokstr = lj_strfmt_pushvf((lua_State *)argp[0].reg_save_area,lj_err_allmsg + (int)em,
                            (__va_list_tag *)local_c8);
  if (L != (lua_State *)0x0) {
    tokstr = lj_strfmt_pushf((lua_State *)argp[0].reg_save_area,lj_err_allmsg + 0x86e,tokstr,L);
  }
  if (1 < cp->linenumber) {
    tokstr = lj_strfmt_pushf((lua_State *)argp[0].reg_save_area,"%s at line %d",tokstr,
                             (ulong)(uint)cp->linenumber);
  }
  lj_err_callermsg((lua_State *)argp[0].reg_save_area,tokstr);
}

Assistant:

LJ_NORET static void cp_errmsg(CPState *cp, CPToken tok, ErrMsg em, ...)
{
  const char *msg, *tokstr;
  lua_State *L;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == CTOK_IDENT || tok == CTOK_INTEGER || tok == CTOK_STRING ||
	     tok >= CTOK_FIRSTDECL) {
    if (cp->sb.w == cp->sb.b) cp_save(cp, '$');
    cp_save(cp, '\0');
    tokstr = cp->sb.b;
  } else {
    tokstr = cp_tok2str(cp, tok);
  }
  L = cp->L;
  va_start(argp, em);
  msg = lj_strfmt_pushvf(L, err2msg(em), argp);
  va_end(argp);
  if (tokstr)
    msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tokstr);
  if (cp->linenumber > 1)
    msg = lj_strfmt_pushf(L, "%s at line %d", msg, cp->linenumber);
  lj_err_callermsg(L, msg);
}